

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_info.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *out;
  uint16_t uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  bool bVar5;
  FILE *__stream;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  pointer pMVar10;
  vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
  *pvVar11;
  size_type sVar12;
  size_type sVar13;
  char *args;
  string *format;
  const_reference pvVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  char *in_RCX;
  char *local_350;
  bool local_291;
  allocator<char> local_251;
  string local_250;
  byte local_22a;
  allocator<char> local_229;
  undefined1 local_228 [8];
  string compress_info;
  string local_200 [4];
  bool is_compressed;
  byte local_1da;
  allocator<char> local_1d9;
  undefined1 local_1d8 [8];
  string name_info;
  undefined1 local_1b0 [4];
  uint i_1;
  undefined1 local_1a0 [8];
  unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> mrg;
  undefined1 local_190 [7];
  bool has_nam;
  Nam nam;
  string nam_raw;
  string local_150 [32];
  undefined1 local_130 [8];
  string nam_filename;
  undefined1 local_108 [8];
  shared_ptr<mg::fs::MappedFile> mrg_data;
  undefined1 local_f0 [8];
  string hed_raw;
  string local_c8 [32];
  undefined1 local_a8 [8];
  string mrg_filename;
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  string hed_filename;
  string *psStack_28;
  int i;
  char *input_basename;
  bool csv;
  char **argv_local;
  int argc_local;
  
  bVar5 = false;
  psStack_28 = (string *)0x0;
  for (hed_filename.field_2._12_4_ = 1; (int)hed_filename.field_2._12_4_ < argc;
      hed_filename.field_2._12_4_ = hed_filename.field_2._12_4_ + 1) {
    in_RCX = (char *)(long)(int)hed_filename.field_2._12_4_;
    iVar8 = strcmp(argv[(long)in_RCX],"--csv");
    if (iVar8 == 0) {
      bVar5 = true;
    }
    else {
      if (psStack_28 != (string *)0x0) {
        usage(*argv);
        return -1;
      }
      in_RCX = (char *)(long)(int)hed_filename.field_2._12_4_;
      psStack_28 = (string *)argv[(long)in_RCX];
    }
  }
  if (psStack_28 == (string *)0x0) {
    usage(*argv);
    return -1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"%s.hed",&local_71);
  mg::string::format<char_const*>((string *)local_50,(string *)local_70,psStack_28,in_RCX);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"%s.mrg",(allocator<char> *)(hed_raw.field_2._M_local_buf + 0xf));
  mg::string::format<char_const*>((string *)local_a8,(string *)local_c8,psStack_28,in_RCX);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(hed_raw.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_f0);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  bVar7 = mg::fs::read_file(pcVar9,(string *)local_f0);
  if (!bVar7) {
    argv_local._4_4_ = -1;
    mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
    goto LAB_0010d2c3;
  }
  iVar8 = std::__cxx11::string::c_str();
  mg::fs::MappedFile::open(nam_filename.field_2._M_local_buf + 8,iVar8);
  std::shared_ptr<mg::fs::MappedFile>::
  shared_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>,void>
            ((shared_ptr<mg::fs::MappedFile> *)local_108,
             (unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
             ((long)&nam_filename.field_2 + 8));
  std::unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_>::~unique_ptr
            ((unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
             ((long)&nam_filename.field_2 + 8));
  bVar7 = std::operator==((shared_ptr<mg::fs::MappedFile> *)local_108,(nullptr_t)0x0);
  if (bVar7) {
    argv_local._4_4_ = -1;
    mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_150,"%s.nam",(allocator<char> *)(nam_raw.field_2._M_local_buf + 0xf));
    mg::string::format<char_const*>((string *)local_130,(string *)local_150,psStack_28,in_RCX);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)(nam_raw.field_2._M_local_buf + 0xf));
    out = &nam.names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::string((string *)out);
    mg::data::Nam::Nam((Nam *)local_190);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    bVar7 = mg::fs::read_file(pcVar9,(string *)out);
    local_291 = false;
    if (bVar7) {
      local_291 = mg::data::nam_read((string *)
                                     &nam.names.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (Nam *)local_190);
    }
    mrg._M_t.super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>.
    _M_t.super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
    super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._7_1_ = local_291;
    std::shared_ptr<mg::fs::MappedFile>::shared_ptr
              ((shared_ptr<mg::fs::MappedFile> *)local_1b0,
               (shared_ptr<mg::fs::MappedFile> *)local_108);
    mg::data::MappedMrg::parse
              ((MappedMrg *)local_1a0,(string *)local_f0,(shared_ptr<mg::fs::MappedFile> *)local_1b0
              );
    std::shared_ptr<mg::fs::MappedFile>::~shared_ptr((shared_ptr<mg::fs::MappedFile> *)local_1b0);
    bVar7 = std::operator==((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                             *)local_1a0,(nullptr_t)0x0);
    if (bVar7) {
      argv_local._4_4_ = -1;
    }
    else {
      if ((mrg._M_t.
           super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>.
           _M_t.
           super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>.
           super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._7_1_ & 1) != 0) {
        pMVar10 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>::
                  operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                              *)local_1a0);
        pvVar11 = mg::data::MappedMrg::entries(pMVar10);
        sVar12 = std::
                 vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                 ::size(pvVar11);
        sVar13 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_190);
        __stream = _stderr;
        if (sVar12 != sVar13) {
          pMVar10 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                    ::operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                                  *)local_1a0);
          pvVar11 = mg::data::MappedMrg::entries(pMVar10);
          sVar12 = std::
                   vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                   ::size(pvVar11);
          sVar13 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_190);
          fprintf(__stream,"MRG entry count (%lu) does not match NAM entry count (%lu)\n",sVar12,
                  sVar13);
          argv_local._4_4_ = -1;
          goto LAB_0010d243;
        }
      }
      name_info.field_2._12_4_ = 0;
      while( true ) {
        pcVar9 = (char *)(ulong)(uint)name_info.field_2._12_4_;
        pMVar10 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>::
                  operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                              *)local_1a0);
        pvVar11 = mg::data::MappedMrg::entries(pMVar10);
        args = (char *)std::
                       vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                       ::size(pvVar11);
        if (args <= pcVar9) break;
        local_1da = 0;
        compress_info.field_2._M_local_buf[0xe] = '\0';
        compress_info.field_2._M_local_buf[0xd] = '\0';
        if ((mrg._M_t.
             super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>.
             _M_t.
             super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
             .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._7_1_ & 1) == 0) {
          std::allocator<char>::allocator();
          local_1da = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)local_1d8,"",&local_1d9);
        }
        else {
          std::allocator<char>::allocator();
          compress_info.field_2._M_local_buf[0xe] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    (local_200,", Name: \'%s\'",
                     (allocator<char> *)(compress_info.field_2._M_local_buf + 0xf));
          compress_info.field_2._M_local_buf[0xd] = '\x01';
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_190,(ulong)(uint)name_info.field_2._12_4_);
          format = (string *)std::__cxx11::string::c_str();
          mg::string::format<char_const*>((string *)local_1d8,(string *)local_200,format,args);
        }
        if ((compress_info.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::__cxx11::string::~string(local_200);
        }
        if ((compress_info.field_2._M_local_buf[0xe] & 1U) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)(compress_info.field_2._M_local_buf + 0xf));
        }
        if ((local_1da & 1) != 0) {
          std::allocator<char>::~allocator(&local_1d9);
        }
        pMVar10 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>::
                  operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                              *)local_1a0);
        pvVar11 = mg::data::MappedMrg::entries(pMVar10);
        pvVar14 = std::
                  vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                  ::operator[](pvVar11,(ulong)(uint)name_info.field_2._12_4_);
        uVar1 = pvVar14->size_sectors;
        pMVar10 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>::
                  operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                              *)local_1a0);
        pvVar11 = mg::data::MappedMrg::entries(pMVar10);
        pvVar14 = std::
                  vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                  ::operator[](pvVar11,(ulong)(uint)name_info.field_2._12_4_);
        compress_info.field_2._M_local_buf[0xc] = uVar1 != pvVar14->size_uncompressed_sectors;
        local_22a = 0;
        if ((bool)compress_info.field_2._M_local_buf[0xc]) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,", Uncompressed size 0x%08x sectors",&local_251);
          pMVar10 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                    ::operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                                  *)local_1a0);
          pvVar11 = mg::data::MappedMrg::entries(pMVar10);
          pvVar14 = std::
                    vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                    ::operator[](pvVar11,(ulong)(uint)name_info.field_2._12_4_);
          mg::string::format<unsigned_short>
                    ((string *)local_228,&local_250,pvVar14->size_uncompressed_sectors);
          std::__cxx11::string::~string((string *)&local_250);
          std::allocator<char>::~allocator(&local_251);
        }
        else {
          std::allocator<char>::allocator();
          local_22a = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)local_228,"",&local_229);
        }
        if ((local_22a & 1) != 0) {
          std::allocator<char>::~allocator(&local_229);
        }
        uVar6 = name_info.field_2._12_4_;
        if (bVar5) {
          pMVar10 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                    ::operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                                  *)local_1a0);
          pvVar11 = mg::data::MappedMrg::entries(pMVar10);
          pvVar14 = std::
                    vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                    ::operator[](pvVar11,(ulong)(uint)name_info.field_2._12_4_);
          uVar4 = pvVar14->offset;
          pMVar10 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                    ::operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                                  *)local_1a0);
          pvVar11 = mg::data::MappedMrg::entries(pMVar10);
          pvVar14 = std::
                    vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                    ::operator[](pvVar11,(ulong)(uint)name_info.field_2._12_4_);
          uVar2 = pvVar14->size_sectors;
          pMVar10 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                    ::operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                                  *)local_1a0);
          pvVar11 = mg::data::MappedMrg::entries(pMVar10);
          pvVar14 = std::
                    vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                    ::operator[](pvVar11,(ulong)(uint)name_info.field_2._12_4_);
          uVar3 = pvVar14->size_uncompressed_sectors;
          if ((mrg._M_t.
               super___uniq_ptr_impl<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
               ._M_t.
               super__Tuple_impl<0UL,_mg::data::MappedMrg_*,_std::default_delete<mg::data::MappedMrg>_>
               .super__Head_base<0UL,_mg::data::MappedMrg_*,_false>._M_head_impl._7_1_ & 1) == 0) {
            local_350 = "";
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_190,(ulong)(uint)name_info.field_2._12_4_);
            local_350 = (char *)std::__cxx11::string::c_str();
          }
          printf("%u,0x%08x,0x%08x,0x%08x,%s\n",(ulong)(uint)uVar6,(ulong)uVar4,(ulong)uVar2,
                 (ulong)uVar3,local_350);
        }
        else {
          pMVar10 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                    ::operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                                  *)local_1a0);
          pvVar11 = mg::data::MappedMrg::entries(pMVar10);
          pvVar14 = std::
                    vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                    ::operator[](pvVar11,(ulong)(uint)name_info.field_2._12_4_);
          uVar4 = pvVar14->offset;
          pMVar10 = std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                    ::operator->((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>
                                  *)local_1a0);
          pvVar11 = mg::data::MappedMrg::entries(pMVar10);
          pvVar14 = std::
                    vector<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                    ::operator[](pvVar11,(ulong)(uint)name_info.field_2._12_4_);
          uVar2 = pvVar14->size_sectors;
          uVar15 = std::__cxx11::string::c_str();
          uVar16 = std::__cxx11::string::c_str();
          printf("Entry %8u: Offset 0x%08x, Size 0x%08x sectors%s%s\n",(ulong)(uint)uVar6,
                 (ulong)uVar4,(ulong)uVar2,uVar15,uVar16);
        }
        std::__cxx11::string::~string((string *)local_228);
        std::__cxx11::string::~string((string *)local_1d8);
        name_info.field_2._12_4_ = name_info.field_2._12_4_ + 1;
      }
      argv_local._4_4_ = 0;
    }
LAB_0010d243:
    mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = 1;
    std::unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_>::~unique_ptr
              ((unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> *)
               local_1a0);
    mg::data::Nam::~Nam((Nam *)local_190);
    std::__cxx11::string::~string
              ((string *)
               &nam.names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_130);
  }
  std::shared_ptr<mg::fs::MappedFile>::~shared_ptr((shared_ptr<mg::fs::MappedFile> *)local_108);
LAB_0010d2c3:
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_50);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
  // Parse args
  bool csv = false;
  const char *input_basename = nullptr;

  for (int i = 1; i < argc; i++) {
    if (!strcmp(argv[i], "--csv")) {
      csv = true;
      continue;
    }
    if (input_basename == nullptr) {
      input_basename = argv[i];
      continue;
    }
    usage(argv[0]);
    return -1;
  }

  if (input_basename == nullptr) {
    usage(argv[0]);
    return -1;
  }

  // Test for input files
  const std::string hed_filename = mg::string::format("%s.hed", input_basename);
  const std::string mrg_filename = mg::string::format("%s.mrg", input_basename);

  // Read raw data for hed files
  std::string hed_raw;
  if (!mg::fs::read_file(hed_filename.c_str(), hed_raw)) {
    return -1;
  }

  // Try and map the mrg data
  std::shared_ptr<mg::fs::MappedFile> mrg_data =
      mg::fs::MappedFile::open(mrg_filename.c_str());
  if (mrg_data == nullptr) {
    return -1;
  }

  // Try and read the NAM table as well. If we can't that's OK
  const std::string nam_filename = mg::string::format("%s.nam", input_basename);
  std::string nam_raw;
  mg::data::Nam nam;
  const bool has_nam = mg::fs::read_file(nam_filename.c_str(), nam_raw) &&
                       nam_read(nam_raw, nam);

  // Parse the MRG data
  auto mrg = mg::data::MappedMrg::parse(hed_raw, mrg_data);
  if (mrg == nullptr) {
    return -1;
  }

  // If we have a NAM and MRG, assert that the filename count matches the entry
  // count
  if (has_nam && mrg->entries().size() != nam.names.size()) {
    fprintf(stderr,
            "MRG entry count (%lu) does not match NAM entry count (%lu)\n",
            mrg->entries().size(), nam.names.size());
    return -1;
  }

  // Print some info
  for (unsigned i = 0; i < mrg->entries().size(); i++) {
    const std::string name_info =
        !has_nam ? ""
                 : mg::string::format(", Name: '%s'", nam.names[i].c_str());
    const bool is_compressed = mrg->entries()[i].size_sectors !=
                               mrg->entries()[i].size_uncompressed_sectors;
    const std::string compress_info =
        !is_compressed
            ? ""
            : mg::string::format(", Uncompressed size 0x%08x sectors",
                                 mrg->entries()[i].size_uncompressed_sectors);
    if (csv) {
      printf("%u,0x%08x,0x%08x,0x%08x,%s\n", i, mrg->entries()[i].offset,
             mrg->entries()[i].size_sectors,
             mrg->entries()[i].size_uncompressed_sectors,
             has_nam ? nam.names[i].c_str() : "");
    } else {
      printf("Entry %8u: Offset 0x%08x, Size 0x%08x sectors%s%s\n", i,
             mrg->entries()[i].offset, mrg->entries()[i].size_sectors,
             compress_info.c_str(), name_info.c_str());
    }
  }

  return 0;
}